

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DateTimeValidator::setEnumeration(DateTimeValidator *this,MemoryManager *param_1)

{
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *this_00;
  int iVar1;
  XMLSize_t maxElems;
  RefVectorOf<xercesc_4_0::XMLNumber> *this_01;
  char16_t *pcVar2;
  undefined4 extraout_var;
  XMLSize_t local_38;
  XMLSize_t i;
  XMLSize_t enumLength;
  MemoryManager *param_1_local;
  DateTimeValidator *this_local;
  
  if ((this->super_AbstractNumericFacetValidator).fStrEnumeration !=
      (RefArrayVectorOf<char16_t> *)0x0) {
    maxElems = BaseRefVectorOf<char16_t>::size
                         (&((this->super_AbstractNumericFacetValidator).fStrEnumeration)->
                           super_BaseRefVectorOf<char16_t>);
    this_01 = (RefVectorOf<xercesc_4_0::XMLNumber> *)
              XMemory::operator_new
                        (0x30,(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                              fMemoryManager);
    RefVectorOf<xercesc_4_0::XMLNumber>::RefVectorOf
              (this_01,maxElems,true,
               (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.fMemoryManager);
    (this->super_AbstractNumericFacetValidator).fEnumeration = this_01;
    (this->super_AbstractNumericFacetValidator).fEnumerationInherited = false;
    for (local_38 = 0; local_38 < maxElems; local_38 = local_38 + 1) {
      this_00 = &((this->super_AbstractNumericFacetValidator).fEnumeration)->
                 super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
      pcVar2 = BaseRefVectorOf<char16_t>::elementAt
                         (&((this->super_AbstractNumericFacetValidator).fStrEnumeration)->
                           super_BaseRefVectorOf<char16_t>,local_38);
      iVar1 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x17])
                        (this,pcVar2,
                         (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                         fMemoryManager);
      BaseRefVectorOf<xercesc_4_0::XMLNumber>::insertElementAt
                (this_00,(XMLNumber *)CONCAT44(extraout_var,iVar1),local_38);
    }
  }
  return;
}

Assistant:

void DateTimeValidator::setEnumeration(MemoryManager* const)
{
// to do: do we need to check against base value space???

    if (!fStrEnumeration)
        return;

    XMLSize_t enumLength = fStrEnumeration->size();
    fEnumeration = new (fMemoryManager) RefVectorOf<XMLNumber>(enumLength, true, fMemoryManager);
    fEnumerationInherited = false;

    for ( XMLSize_t i = 0; i < enumLength; i++)
        fEnumeration->insertElementAt(parse(fStrEnumeration->elementAt(i), fMemoryManager), i);

}